

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O0

bool __thiscall State::AddDefault(State *this,StringPiece path,string *err)

{
  bool bVar1;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  State *local_48;
  char *local_40;
  Node *local_38;
  Node *node;
  string *err_local;
  State *this_local;
  StringPiece path_local;
  
  local_40 = (char *)path.len_;
  local_48 = (State *)path.str_;
  node = (Node *)err;
  err_local = (string *)this;
  this_local = local_48;
  path_local.str_ = local_40;
  local_38 = LookupNode(this,path);
  bVar1 = local_38 != (Node *)0x0;
  if (bVar1) {
    std::vector<Node_*,_std::allocator<Node_*>_>::push_back(&this->defaults_,&local_38);
  }
  else {
    StringPiece::AsString_abi_cxx11_(&local_a8,(StringPiece *)&this_local);
    std::operator+(&local_88,"unknown target \'",&local_a8);
    std::operator+(&local_68,&local_88,"\'");
    std::__cxx11::string::operator=((string *)node,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return bVar1;
}

Assistant:

bool State::AddDefault(StringPiece path, string* err) {
  Node* node = LookupNode(path);
  if (!node) {
    *err = "unknown target '" + path.AsString() + "'";
    return false;
  }
  defaults_.push_back(node);
  return true;
}